

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

float get_color(int c,int x,int max)

{
  double dVar1;
  double dVar2;
  float fVar3;
  
  fVar3 = ((float)x / (float)max) * 5.0;
  dVar1 = (double)fVar3;
  dVar2 = floor(dVar1);
  dVar1 = ceil(dVar1);
  fVar3 = fVar3 - (float)(int)dVar2;
  return (1.0 - fVar3) * *(float *)(&DAT_001185f0 + (ulong)(uint)c * 4 + (long)(int)dVar2 * 0xc) +
         fVar3 * *(float *)(&DAT_001185f0 + (ulong)(uint)c * 4 + (long)(int)dVar1 * 0xc);
}

Assistant:

static float get_color(int c, int x, int max)
{
    float colors[6][3] = { {1,0,1}, {0,0,1}, {0,1,1}, {0,1,0}, {1,1,0}, {1,0,0} };
    float ratio = ((float)x/max)*5;
    int i = floor(ratio);
    int j = ceil(ratio);
    ratio -= i;
    float r = (1-ratio) * colors[i][c] + ratio*colors[j][c];
    return r;
}